

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O0

RPCHelpMan * getmempoolinfo(void)

{
  initializer_list<RPCResult> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff0d8;
  RPCResult *pRVar2;
  anon_class_1_0_00000001 *in_stack_fffffffffffff0e0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff0e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff110;
  allocator<char> *in_stack_fffffffffffff118;
  iterator in_stack_fffffffffffff120;
  undefined1 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff128;
  undefined8 in_stack_fffffffffffff138;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff140;
  string *in_stack_fffffffffffff148;
  RPCResult *in_stack_fffffffffffff150;
  undefined8 in_stack_fffffffffffff158;
  Type type;
  allocator<char> *this;
  RPCResult *in_stack_fffffffffffff160;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  allocator<char> local_ccd;
  allocator<char> local_ccc;
  allocator<char> local_ccb;
  allocator<char> local_cca;
  allocator<char> local_cc9;
  pointer local_cc8;
  _Alloc_hider fun;
  allocator<char> local_caa;
  allocator<char> local_ca9 [9];
  pointer pRStack_ca0;
  undefined1 local_c98 [15];
  allocator<char> local_c89;
  _Alloc_hider local_c88;
  _Alloc_hider _Stack_c80;
  undefined1 local_c78 [24];
  _Alloc_hider _Stack_c60;
  size_type local_c58;
  allocator<char> local_c4a;
  allocator<char> local_c49 [9];
  undefined8 uStack_c40;
  undefined8 local_c38;
  allocator<char> local_c29;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  allocator<char> local_c0a;
  allocator<char> local_c09;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined1 local_be9 [9];
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined1 local_bca;
  undefined1 local_bc9 [9];
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  allocator<char> local_baa;
  allocator<char> local_ba9;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  allocator<char> local_b8a;
  allocator<char> local_b89;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  allocator<char> local_b62;
  allocator<char> local_b61 [31];
  allocator<char> local_b42;
  allocator<char> local_b41 [25];
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  allocator<char> local_b0a;
  allocator<char> local_b09 [1057];
  undefined1 local_6e8 [408];
  string local_550 [34];
  undefined1 local_110 [264];
  long local_8;
  
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff138 >> 0x38);
  type = (Type)((ulong)in_stack_fffffffffffff158 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  local_b28 = 0;
  uStack_b20 = 0;
  local_b18 = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff0d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  local_b88 = 0;
  uStack_b80 = 0;
  local_b78 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0d8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff160,type,(string *)in_stack_fffffffffffff150,
             in_stack_fffffffffffff148,in_stack_fffffffffffff140,(bool)skip_type_check);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  local_ba8 = 0;
  uStack_ba0 = 0;
  local_b98 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0d8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff160,type,(string *)in_stack_fffffffffffff150,
             in_stack_fffffffffffff148,in_stack_fffffffffffff140,(bool)skip_type_check);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  local_bc9._1_8_ = 0;
  uStack_bc0 = 0;
  local_bb8 = 0;
  this_00 = (RPCHelpMan *)(local_bc9 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0d8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff160,type,(string *)in_stack_fffffffffffff150,
             in_stack_fffffffffffff148,in_stack_fffffffffffff140,(bool)skip_type_check);
  description = local_550;
  name = (string *)local_bc9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_bca;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  local_be9._1_8_ = 0;
  uStack_be0 = 0;
  local_bd8 = 0;
  results = (RPCResults *)(local_be9 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0d8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff160,type,(string *)in_stack_fffffffffffff150,
             in_stack_fffffffffffff148,in_stack_fffffffffffff140,(bool)skip_type_check);
  examples = (RPCExamples *)local_be9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::operator+((char *)in_stack_fffffffffffff128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff120);
  std::operator+(in_stack_fffffffffffff0f0,(char *)in_stack_fffffffffffff0e8);
  local_c08 = 0;
  uStack_c00 = 0;
  local_bf8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0d8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff160,type,(string *)in_stack_fffffffffffff150,
             in_stack_fffffffffffff148,in_stack_fffffffffffff140,(bool)skip_type_check);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  local_c28 = 0;
  uStack_c20 = 0;
  local_c18 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0d8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff160,type,(string *)in_stack_fffffffffffff150,
             in_stack_fffffffffffff148,in_stack_fffffffffffff140,(bool)skip_type_check);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::operator+((char *)in_stack_fffffffffffff128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff120);
  std::operator+(in_stack_fffffffffffff0f0,(char *)in_stack_fffffffffffff0e8);
  local_c49[1] = (allocator<char>)0x0;
  local_c49[2] = (allocator<char>)0x0;
  local_c49[3] = (allocator<char>)0x0;
  local_c49[4] = (allocator<char>)0x0;
  local_c49[5] = (allocator<char>)0x0;
  local_c49[6] = (allocator<char>)0x0;
  local_c49[7] = (allocator<char>)0x0;
  local_c49[8] = (allocator<char>)0x0;
  uStack_c40 = 0;
  local_c38 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0d8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff160,type,(string *)in_stack_fffffffffffff150,
             in_stack_fffffffffffff148,in_stack_fffffffffffff140,(bool)skip_type_check);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  local_c78._16_8_ = 0;
  _Stack_c60._M_p = (pointer)0x0;
  local_c58 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0d8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff160,type,(string *)in_stack_fffffffffffff150,
             in_stack_fffffffffffff148,in_stack_fffffffffffff140,(bool)skip_type_check);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::operator+((char *)in_stack_fffffffffffff128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff120);
  std::operator+(in_stack_fffffffffffff0f0,(char *)in_stack_fffffffffffff0e8);
  local_c88._M_p = (pointer)0x0;
  _Stack_c80._M_p = (pointer)0x0;
  local_c78._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0d8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff160,type,(string *)in_stack_fffffffffffff150,
             in_stack_fffffffffffff148,in_stack_fffffffffffff140,(bool)skip_type_check);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  local_ca9[1] = (allocator<char>)0x0;
  local_ca9[2] = (allocator<char>)0x0;
  local_ca9[3] = (allocator<char>)0x0;
  local_ca9[4] = (allocator<char>)0x0;
  local_ca9[5] = (allocator<char>)0x0;
  local_ca9[6] = (allocator<char>)0x0;
  local_ca9[7] = (allocator<char>)0x0;
  local_ca9[8] = (allocator<char>)0x0;
  pRStack_ca0 = (pointer)0x0;
  local_c98._0_8_ = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0d8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff160,type,(string *)in_stack_fffffffffffff150,
             in_stack_fffffffffffff148,in_stack_fffffffffffff140,(bool)skip_type_check);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  local_cc8 = (pointer)0x0;
  fun._M_p = (pointer)0x0;
  pRVar2 = (RPCResult *)&local_cc8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0d8);
  RPCResult::RPCResult
            (pRVar2,type,(string *)in_stack_fffffffffffff150,in_stack_fffffffffffff148,
             in_stack_fffffffffffff140,(bool)skip_type_check);
  this = &local_cc9;
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff0d8);
  __l._M_len = (size_type)in_stack_fffffffffffff128;
  __l._M_array = in_stack_fffffffffffff120;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff118,__l,
             (allocator_type *)in_stack_fffffffffffff110);
  RPCResult::RPCResult
            (pRVar2,(Type)((ulong)this >> 0x20),(string *)in_stack_fffffffffffff150,
             in_stack_fffffffffffff148,in_stack_fffffffffffff140,(bool)skip_type_check);
  RPCResults::RPCResults((RPCResults *)this,in_stack_fffffffffffff150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  HelpExampleCli(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff128,(char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  HelpExampleRpc(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  std::operator+(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff0d8,(string *)0x5e9e9c);
  pRVar2 = (RPCResult *)&stack0xfffffffffffff310;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getmempoolinfo()::__0,void>(in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0);
  RPCHelpMan::RPCHelpMan(this_00,name,description,args,results,examples,(RPCMethodImpl *)fun._M_p);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)pRVar2);
  RPCExamples::~RPCExamples((RPCExamples *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_ccd);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_ccc);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_ccb);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_cca);
  RPCResults::~RPCResults((RPCResults *)pRVar2);
  RPCResult::~RPCResult(pRVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0e8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)pRVar2);
  puVar3 = local_6e8;
  puVar1 = local_110;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult(pRVar2);
  } while (puVar1 != puVar3);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_caa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(local_ca9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator((allocator<char> *)(local_c98 + 0xe));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_c89);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator((allocator<char> *)(local_c78 + 0xf));
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_c4a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(local_c49);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_c29);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_c0a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_c09);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator((allocator<char> *)local_be9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator((allocator<char> *)&local_bca);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator((allocator<char> *)local_bc9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_baa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_ba9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_b8a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_b89);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_b62);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(local_b61);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_b42);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(local_b41);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_b0a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(local_b09);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getmempoolinfo()
{
    return RPCHelpMan{"getmempoolinfo",
        "Returns details on the active state of the TX memory pool.",
        {},
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::BOOL, "loaded", "True if the initial load attempt of the persisted mempool finished"},
                {RPCResult::Type::NUM, "size", "Current tx count"},
                {RPCResult::Type::NUM, "bytes", "Sum of all virtual transaction sizes as defined in BIP 141. Differs from actual serialized size because witness data is discounted"},
                {RPCResult::Type::NUM, "usage", "Total memory usage for the mempool"},
                {RPCResult::Type::STR_AMOUNT, "total_fee", "Total fees for the mempool in " + CURRENCY_UNIT + ", ignoring modified fees through prioritisetransaction"},
                {RPCResult::Type::NUM, "maxmempool", "Maximum memory usage for the mempool"},
                {RPCResult::Type::STR_AMOUNT, "mempoolminfee", "Minimum fee rate in " + CURRENCY_UNIT + "/kvB for tx to be accepted. Is the maximum of minrelaytxfee and minimum mempool fee"},
                {RPCResult::Type::STR_AMOUNT, "minrelaytxfee", "Current minimum relay fee for transactions"},
                {RPCResult::Type::NUM, "incrementalrelayfee", "minimum fee rate increment for mempool limiting or replacement in " + CURRENCY_UNIT + "/kvB"},
                {RPCResult::Type::NUM, "unbroadcastcount", "Current number of transactions that haven't passed initial broadcast yet"},
                {RPCResult::Type::BOOL, "fullrbf", "True if the mempool accepts RBF without replaceability signaling inspection"},
            }},
        RPCExamples{
            HelpExampleCli("getmempoolinfo", "")
            + HelpExampleRpc("getmempoolinfo", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    return MempoolInfoToJSON(EnsureAnyMemPool(request.context));
},
    };
}